

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# joint.cpp
# Opt level: O0

void __thiscall
CMU462::DynamicScene::Joint::getAxes
          (Joint *this,vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> *axes)

{
  reference pvVar1;
  Vector3D local_330;
  Vector3D local_318;
  Vector3D local_300;
  Vector3D local_2e8;
  Vector3D local_2d0;
  Vector3D local_2b8;
  Matrix4x4 local_2a0;
  Matrix4x4 local_220;
  Matrix4x4 local_1a0;
  Matrix4x4 local_120;
  Joint *local_a0;
  Joint *j;
  Matrix4x4 T;
  vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> *axes_local;
  Joint *this_local;
  
  T.entries[3].w = (double)axes;
  Matrix4x4::identity();
  for (local_a0 = this->parent; local_a0 != (Joint *)0x0; local_a0 = local_a0->parent) {
    (*(local_a0->super_SceneObject)._vptr_SceneObject[0xc])(&local_1a0);
    Matrix4x4::operator*(&local_120,&local_1a0,(Matrix4x4 *)&j);
    memcpy(&j,&local_120,0x80);
  }
  (*(this->skeleton->mesh->super_SceneObject)._vptr_SceneObject[0xc])(&local_2a0);
  Matrix4x4::operator*(&local_220,&local_2a0,(Matrix4x4 *)&j);
  memcpy(&j,&local_220,0x80);
  std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::resize
            ((vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> *)T.entries[3].w,3);
  Vector3D::Vector3D(&local_2d0,1.0,0.0,0.0);
  Matrix4x4::operator*(&local_2b8,(Matrix4x4 *)&j,&local_2d0);
  pvVar1 = std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::operator[]
                     ((vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> *)T.entries[3].w,
                      0);
  pvVar1->x = local_2b8.x;
  pvVar1->y = local_2b8.y;
  pvVar1->z = local_2b8.z;
  Vector3D::Vector3D(&local_300,0.0,1.0,0.0);
  Matrix4x4::operator*(&local_2e8,(Matrix4x4 *)&j,&local_300);
  pvVar1 = std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::operator[]
                     ((vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> *)T.entries[3].w,
                      1);
  pvVar1->x = local_2e8.x;
  pvVar1->y = local_2e8.y;
  pvVar1->z = local_2e8.z;
  Vector3D::Vector3D(&local_330,0.0,0.0,1.0);
  Matrix4x4::operator*(&local_318,(Matrix4x4 *)&j,&local_330);
  pvVar1 = std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::operator[]
                     ((vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> *)T.entries[3].w,
                      2);
  pvVar1->x = local_318.x;
  pvVar1->y = local_318.y;
  pvVar1->z = local_318.z;
  return;
}

Assistant:

void Joint::getAxes(vector<Vector3D>& axes)
   {
     Matrix4x4 T = Matrix4x4::identity();
     for (Joint* j = parent; j != nullptr; j = j->parent)
     {
       T = j->getRotation() * T;
     }
     T = skeleton->mesh->getRotation() * T;
     axes.resize(3);
     axes[0] = T * Vector3D(1., 0., 0.);
     axes[1] = T * Vector3D(0., 1., 0.);
     axes[2] = T *Vector3D(0., 0., 1.);
   }